

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_reader.c
# Opt level: O0

int dlep_reader_peer_type
              (char *text,size_t text_length,_Bool *secured_medium,dlep_session *session,
              dlep_parser_value *value)

{
  byte *pbVar1;
  uint8_t *ptr;
  dlep_parser_value *value_local;
  dlep_session *session_local;
  _Bool *secured_medium_local;
  size_t text_length_local;
  char *text_local;
  
  ptr = (uint8_t *)value;
  if ((value == (dlep_parser_value *)0x0) &&
     (ptr = (uint8_t *)dlep_session_get_tlv_value(session,4),
     (dlep_parser_value *)ptr == (dlep_parser_value *)0x0)) {
    text_local._4_4_ = -1;
  }
  else if (*(short *)(ptr + 6) == 0) {
    text_local._4_4_ = -1;
  }
  else {
    pbVar1 = (session->parser).tlv_ptr + *(ushort *)(ptr + 4);
    *secured_medium = (*pbVar1 & 1) != 0;
    if ((1 < *(ushort *)(ptr + 6)) && (text_length != 0)) {
      if ((ulong)(*(ushort *)(ptr + 6) - 1) < text_length - 1) {
        memcpy(text,pbVar1 + 1,(ulong)(*(ushort *)(ptr + 6) - 1));
        text[*(ushort *)(ptr + 6) - 1] = '\0';
      }
      else {
        memcpy(text,pbVar1 + 1,text_length - 2);
        text[text_length - 2] = '\0';
      }
    }
    text_local._4_4_ = 0;
  }
  return text_local._4_4_;
}

Assistant:

int
dlep_reader_peer_type(
  char *text, size_t text_length, bool *secured_medium, struct dlep_session *session, struct dlep_parser_value *value) {
  const uint8_t *ptr;

  if (!value) {
    value = dlep_session_get_tlv_value(session, DLEP_PEER_TYPE_TLV);
    if (!value) {
      return -1;
    }
  }
  if (value->length == 0) {
    return -1;
  }

  ptr = dlep_session_get_tlv_binary(session, value);

  *secured_medium = (ptr[0] & DLEP_PEER_TYPE_SECURED) != 0;

  if (value->length > 1 && text_length > 0) {
    /* generate a 0 terminated copy of the text */
    if (text_length - 1u > value->length - 1u) {
      memcpy(text, &ptr[1], value->length - 1u);
      text[value->length - 1u] = 0;
    }
    else {
      memcpy(text, &ptr[1], text_length - 2u);
      text[text_length - 2u] = 0;
    }
  }
  return 0;
}